

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

bool ClipperLib::FindSegment(OutPt **pp,IntPoint *pt1,IntPoint *pt2)

{
  OutPt *pOVar1;
  IntPoint pt2_00;
  IntPoint pt1_00;
  IntPoint pt2_01;
  IntPoint pt1_01;
  IntPoint pt1b;
  IntPoint pt1a;
  bool bVar2;
  OutPt *pOVar3;
  
  pOVar1 = *pp;
  if (pOVar1 != (OutPt *)0x0) {
    pt1a = *pt1;
    pt1_01 = *pt1;
    pt1_00 = *pt1;
    pt1b = *pt2;
    pt2_01 = *pt2;
    pt2_00 = *pt2;
    pOVar3 = pOVar1;
    do {
      bVar2 = SlopesEqual(pt1_00,pt2_00,pOVar3->pt,pOVar3->prev->pt,true);
      if (((bVar2) && (bVar2 = SlopesEqual(pt1_01,pt2_01,(*pp)->pt,true), bVar2)) &&
         (bVar2 = GetOverlapSegment(pt1a,pt1b,(*pp)->pt,(*pp)->prev->pt,pt1,pt2), bVar2)) {
        return true;
      }
      pOVar3 = (*pp)->next;
      *pp = pOVar3;
    } while (pOVar3 != pOVar1);
  }
  return false;
}

Assistant:

bool FindSegment(OutPt* &pp, IntPoint &pt1, IntPoint &pt2)
{
  //outPt1 & outPt2 => the overlap segment (if the function returns true)
  if (!pp) return false;
  OutPt* pp2 = pp;
  IntPoint pt1a = pt1, pt2a = pt2;
  do
  {
    if (SlopesEqual(pt1a, pt2a, pp->pt, pp->prev->pt, true) &&
      SlopesEqual(pt1a, pt2a, pp->pt, true) &&
      GetOverlapSegment(pt1a, pt2a, pp->pt, pp->prev->pt, pt1, pt2))
        return true;
    pp = pp->next;
  }
  while (pp != pp2);
  return false;
}